

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O0

int CfdGetTxOutByHandle(void *handle,void *tx_data_handle,uint32_t index,int64_t *value_satoshi,
                       char **locking_script,char **asset)

{
  undefined8 uVar1;
  int64_t iVar2;
  int64_t *in_RCX;
  uint32_t in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  Amount AVar3;
  CfdException *except;
  exception *std_except;
  ConfidentialTxOutReference ref_1;
  ConfidentialTransactionContext *tx_1;
  TxOutReference ref;
  TransactionContext *tx;
  string temp_asset;
  Script temp_locking_script;
  Amount temp_value;
  bool is_bitcoin;
  CfdCapiTransactionData *tx_data;
  char *work_asset;
  char *work_script;
  int error_code;
  AbstractTxOutReference *in_stack_fffffffffffffc28;
  ConfidentialTxOutReference *in_stack_fffffffffffffc30;
  string *in_stack_fffffffffffffc40;
  undefined8 in_stack_fffffffffffffc48;
  CfdError error_code_00;
  undefined7 in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc57;
  allocator *is_bitcoin_00;
  undefined4 in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffc94;
  string local_360;
  ConfidentialAssetId local_340;
  string local_318;
  int64_t local_2f8;
  undefined1 local_2f0;
  int64_t local_2e8;
  undefined1 local_2e0;
  string *in_stack_fffffffffffffd38;
  _func_int **in_stack_fffffffffffffd40;
  Script local_1d8;
  int64_t local_1a0;
  undefined1 local_198;
  int64_t local_190;
  undefined1 local_188;
  AbstractTxOutReference local_180;
  Transaction *local_130;
  undefined1 local_122;
  allocator local_121;
  string local_120 [32];
  string local_100 [32];
  Script local_e0;
  Amount local_a8;
  byte local_91;
  long local_90;
  allocator local_81;
  string local_80 [48];
  char *local_50;
  char *local_48;
  undefined4 local_3c;
  undefined8 *local_38;
  undefined8 *local_30;
  int64_t *local_28;
  uint32_t local_1c;
  long local_18;
  int local_4;
  
  error_code_00 = (CfdError)((ulong)in_stack_fffffffffffffc48 >> 0x20);
  local_3c = 0xffffffff;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_18 = in_RSI;
  cfd::Initialize();
  is_bitcoin_00 = &local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"TransactionData",is_bitcoin_00);
  cfd::capi::CheckBuffer(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_90 = local_18;
  local_91 = 0;
  cfd::capi::ConvertNetType(in_stack_fffffffffffffc94,(bool *)is_bitcoin_00);
  cfd::core::Amount::Amount(&local_a8);
  cfd::core::Script::Script(&local_e0);
  std::__cxx11::string::string(local_100);
  if (*(long *)(local_90 + 0x18) == 0) {
    local_122 = 1;
    uVar1 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_120,"Invalid handle state. tx is null",&local_121);
    cfd::core::CfdException::CfdException
              ((CfdException *)CONCAT17(in_stack_fffffffffffffc57,in_stack_fffffffffffffc50),
               error_code_00,in_stack_fffffffffffffc40);
    local_122 = 0;
    __cxa_throw(uVar1,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if ((local_91 & 1) == 0) {
    cfd::core::ConfidentialTransaction::GetTxOut
              ((ConfidentialTxOutReference *)&stack0xfffffffffffffd28,
               *(ConfidentialTransaction **)(local_90 + 0x18),local_1c);
    AVar3 = cfd::core::AbstractTxOutReference::GetValue
                      ((AbstractTxOutReference *)&stack0xfffffffffffffd28);
    local_2f8 = AVar3.amount_;
    local_2f0 = AVar3.ignore_check_;
    local_2e8 = local_2f8;
    local_2e0 = local_2f0;
    local_a8.amount_ = local_2f8;
    local_a8.ignore_check_ = (bool)local_2f0;
    cfd::core::ConfidentialTxOutReference::GetAsset
              (&local_340,(ConfidentialTxOutReference *)&stack0xfffffffffffffd28);
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_318,&local_340);
    std::__cxx11::string::operator=(local_100,(string *)&local_318);
    std::__cxx11::string::~string((string *)&local_318);
    cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x660991);
    cfd::core::ConfidentialTxOutReference::~ConfidentialTxOutReference(in_stack_fffffffffffffc30);
  }
  else {
    local_130 = *(Transaction **)(local_90 + 0x18);
    cfd::core::Transaction::GetTxOut((TxOutReference *)&local_180,local_130,local_1c);
    AVar3 = cfd::core::AbstractTxOutReference::GetValue(&local_180);
    local_1a0 = AVar3.amount_;
    local_198 = AVar3.ignore_check_;
    local_190 = local_1a0;
    local_188 = local_198;
    local_a8.amount_ = local_1a0;
    local_a8.ignore_check_ = (bool)local_198;
    cfd::core::AbstractTxOutReference::GetLockingScript(in_stack_fffffffffffffc28);
    cfd::core::Script::operator=(&local_e0,&local_1d8);
    cfd::core::Script::~Script((Script *)in_stack_fffffffffffffc30);
    cfd::core::TxOutReference::~TxOutReference((TxOutReference *)0x66082f);
  }
  if (local_30 != (undefined8 *)0x0) {
    cfd::core::Script::GetHex_abi_cxx11_(&local_360,&local_e0);
    local_48 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
    std::__cxx11::string::~string((string *)&local_360);
  }
  if (local_38 != (undefined8 *)0x0) {
    local_50 = cfd::capi::CreateString
                         ((string *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  }
  if (local_28 != (int64_t *)0x0) {
    iVar2 = cfd::core::Amount::GetSatoshiValue(&local_a8);
    *local_28 = iVar2;
  }
  if (local_30 != (undefined8 *)0x0) {
    *local_30 = local_48;
  }
  if (local_38 != (undefined8 *)0x0) {
    *local_38 = local_50;
  }
  local_4 = 0;
  std::__cxx11::string::~string(local_100);
  cfd::core::Script::~Script((Script *)in_stack_fffffffffffffc30);
  return local_4;
}

Assistant:

int CfdGetTxOutByHandle(
    void* handle, void* tx_data_handle, uint32_t index, int64_t* value_satoshi,
    char** locking_script, char** asset) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  char* work_script = nullptr;
  char* work_asset = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    Amount temp_value;
    Script temp_locking_script;
    std::string temp_asset;
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      TransactionContext* tx =
          static_cast<TransactionContext*>(tx_data->tx_obj);
      const TxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_locking_script = ref.GetLockingScript();
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext* tx =
          static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
      const ConfidentialTxOutReference ref = tx->GetTxOut(index);
      temp_value = ref.GetValue();
      temp_asset = ref.GetAsset().GetHex();
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    if (locking_script != nullptr) {
      work_script = CreateString(temp_locking_script.GetHex());
    }
    if (asset != nullptr) work_asset = CreateString(temp_asset);

    if (value_satoshi != nullptr) {
      *value_satoshi = temp_value.GetSatoshiValue();
    }
    if (locking_script != nullptr) *locking_script = work_script;
    if (asset != nullptr) *asset = work_asset;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_script, &work_asset);
  return error_code;
}